

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool __thiscall
cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::valid_boolean_property
          (rules_holder<cppcms::xss::compare_c_string,_true> *this,c_string *tname,c_string *pname)

{
  c_string *pname_local;
  c_string *tname_local;
  rules_holder<cppcms::xss::compare_c_string,_true> *this_local;
  
  return false;
}

Assistant:

bool valid_boolean_property(c_string const &tname,c_string const &pname) const
		{
			if(IsXHTML) 
				return false;
			typename tags_type::const_iterator pt = tags.find(tname);
			if(pt==tags.end())
				return false;
			typename properties_type::const_iterator pp = pt->second.properties.find(pname);
			if(pp == pt->second.properties.end())
				return false;
			if(pp->second == nullptr)
				return true;
			return false;
		}